

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O3

void operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::ct_constant<8l>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,ct_constant<8L> *t,
               ct_constant<8L> *u,double t2,double u2)

{
  ct_constant<64L> local_2e;
  ct_constant<64L> local_2d;
  ct_constant<0L> local_2c;
  ct_constant<0L> local_2b;
  ct_constant<16L> local_2a;
  ct_constant<16L> local_29;
  double local_28;
  double local_20;
  double local_18;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
  local_c;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
  local_a;
  
  local_28 = t2;
  local_20 = u2;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_29);
  local_18 = local_28 + local_20;
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_18);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_2a);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_18);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_2b);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_28 - local_20);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_2c);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_20 - local_28);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_2d);
  local_18 = local_28 * local_20;
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_18);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_2e);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_18);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_a);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_28 / local_20);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_c);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_20 / local_28);
  return;
}

Assistant:

void operations_test(E & e, T const & t, U const & u, double t2, double u2)
{
  e = t + u; evaluations_test(e, t2 + u2);
  e = u + t; evaluations_test(e, u2 + t2);
  e = t - u; evaluations_test(e, t2 - u2);
  e = u - t; evaluations_test(e, u2 - t2);
  e = t * u; evaluations_test(e, t2 * u2);
  e = u * t; evaluations_test(e, u2 * t2);
  e = t / u; evaluations_test(e, t2 / u2);
  e = u / t; evaluations_test(e, u2 / t2);
}